

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O3

uint8_t * chunkmemset_avx2(uint8_t *out,uint8_t *from,uint len)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar9;
  uint8_t *puVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  chunk_t_conflict chunk_load;
  undefined1 local_40 [32];
  ulong uVar8;
  
  uVar11 = (long)out - (long)from;
  uVar8 = -uVar11;
  if (0 < (long)uVar11) {
    uVar8 = uVar11;
  }
  if (((long)uVar11 < 0) && (uVar11 = (ulong)len, uVar8 < uVar11)) {
    memmove(out,from,uVar11);
    goto LAB_00112d2e;
  }
  if (uVar8 == 1) {
    uVar11 = (ulong)len;
    memset(out,(uint)*from,uVar11);
    goto LAB_00112d2e;
  }
  if (0x1f < uVar8) {
    uVar7 = len - 1 & 0x1f;
    uVar8 = (ulong)uVar7;
    uVar4 = *(undefined8 *)(from + 8);
    uVar5 = *(undefined8 *)(from + 0x10);
    uVar6 = *(undefined8 *)(from + 0x18);
    *(undefined8 *)out = *(undefined8 *)from;
    *(undefined8 *)(out + 8) = uVar4;
    *(undefined8 *)(out + 0x10) = uVar5;
    *(undefined8 *)(out + 0x18) = uVar6;
    if (~uVar7 + len == 0) {
LAB_00112db6:
      return out + uVar8 + 1;
    }
    lVar9 = uVar8 + 1;
    do {
      puVar10 = from + lVar9;
      uVar4 = *(undefined8 *)(puVar10 + 8);
      uVar5 = *(undefined8 *)(puVar10 + 0x10);
      uVar6 = *(undefined8 *)(puVar10 + 0x18);
      puVar1 = out + lVar9;
      *(undefined8 *)puVar1 = *(undefined8 *)puVar10;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      *(undefined8 *)(puVar1 + 0x10) = uVar5;
      *(undefined8 *)(puVar1 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
    } while (len != (uint)lVar9);
LAB_00112d73:
    return out + lVar9;
  }
  if (len < 0x11) {
    if (0xf < uVar8) {
      uVar7 = len - 1 & 0xf;
      uVar8 = (ulong)uVar7;
      uVar4 = *(undefined8 *)(from + 8);
      *(undefined8 *)out = *(undefined8 *)from;
      *(undefined8 *)(out + 8) = uVar4;
      if (~uVar7 + len == 0) goto LAB_00112db6;
      lVar9 = uVar8 + 1;
      do {
        uVar4 = *(undefined8 *)(from + lVar9 + 8);
        *(undefined8 *)(out + lVar9) = *(undefined8 *)(from + lVar9);
        *(undefined8 *)(out + lVar9 + 8) = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (len != (uint)lVar9);
      goto LAB_00112d73;
    }
    if (uVar8 != 6 && (uVar8 & 1) == 0) goto LAB_00112e16;
    auVar13 = vpshufb_avx(*(undefined1 (*) [16])from,
                          *(undefined1 (*) [16])("" + perm_idx_lut[(int)uVar8 - 3].idx));
    if (len == 0x10) {
      *(undefined1 (*) [16])out = auVar13;
      out = out + 0x10;
      len = 0;
    }
    local_40 = ZEXT1632(auVar13);
  }
  else {
LAB_00112e16:
    uVar11 = uVar8 - 2 >> 1;
    if ((uVar11 | uVar8 << 0x3f) < 8) {
      puVar10 = (uint8_t *)(*(code *)(&DAT_0011c624 + *(int *)(&DAT_0011c624 + uVar11 * 4)))();
      return puVar10;
    }
    uVar7 = (int)uVar8 - 3;
    if (uVar8 < 0x10) {
      auVar3 = vpaddb_avx2(*(undefined1 (*) [32])("" + perm_idx_lut[uVar7].idx),_DAT_0011ca20);
      auVar12._16_16_ = *(undefined1 (*) [16])from;
      auVar12._0_16_ = *(undefined1 (*) [16])from;
      local_40 = vpshufb_avx2(auVar12,auVar3);
    }
    else {
      auVar13[8] = 0xf;
      auVar13._0_8_ = 0xf0f0f0f0f0f0f0f;
      auVar13[9] = 0xf;
      auVar13[10] = 0xf;
      auVar13[0xb] = 0xf;
      auVar13[0xc] = 0xf;
      auVar13[0xd] = 0xf;
      auVar13[0xe] = 0xf;
      auVar13[0xf] = 0xf;
      auVar13 = vpcmpgtb_avx(*(undefined1 (*) [16])("" + perm_idx_lut[uVar7].idx),auVar13);
      auVar2 = vpshufb_avx(*(undefined1 (*) [16])from,
                           *(undefined1 (*) [16])("" + perm_idx_lut[uVar7].idx));
      auVar13 = vpblendvb_avx(auVar2,*(undefined1 (*) [16])(from + 0x10),auVar13);
      local_40._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * *(undefined1 (*) [16])from;
      local_40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    }
    uVar7 = 0x20 - perm_idx_lut[uVar7].remval;
    if (0x3f < len) {
      do {
        *(undefined1 (*) [32])out = local_40;
        *(undefined1 (*) [32])(*(undefined1 (*) [32])out + uVar7) = local_40;
        out = *(undefined1 (*) [32])out + uVar7 * 2;
        len = len + uVar7 * -2;
      } while (0x3f < len);
    }
    for (; 0x1f < len; len = len - uVar7) {
      *(undefined8 *)*(undefined1 (*) [32])out = local_40._0_8_;
      *(undefined8 *)(*(undefined1 (*) [32])out + 8) = local_40._8_8_;
      *(undefined8 *)(*(undefined1 (*) [32])out + 0x10) = local_40._16_8_;
      *(undefined8 *)(*(undefined1 (*) [32])out + 0x18) = local_40._24_8_;
      out = *(undefined1 (*) [32])out + uVar7;
    }
  }
  if (len == 0) {
    return (uint8_t *)(undefined1 (*) [32])out;
  }
  uVar11 = (ulong)len;
  memcpy(out,local_40,uVar11);
LAB_00112d2e:
  return *(undefined1 (*) [32])out + uVar11;
}

Assistant:

static inline uint8_t* CHUNKMEMSET(uint8_t *out, uint8_t *from, unsigned len) {
    /* Debug performance related issues when len < sizeof(uint64_t):
       Assert(len >= sizeof(uint64_t), "chunkmemset should be called on larger chunks"); */
    Assert(from != out, "chunkmemset cannot have a distance 0");

    chunk_t chunk_load;
    uint32_t chunk_mod = 0;
    uint32_t adv_amount;
    int64_t sdist = out - from;
    uint64_t dist = llabs(sdist);

    /* We are supporting the case for when we are reading bytes from ahead in the buffer.
     * We now have to handle this, though it wasn't _quite_ clear if this rare circumstance
     * always needed to be handled here or if we're just now seeing it because we are
     * dispatching to this function, more */
    if (sdist < 0 && dist < len) {
#ifdef HAVE_MASKED_READWRITE
        /* We can still handle this case if we can mitigate over writing _and_ we
         * fit the entirety of the copy length with one load */
        if (len <= sizeof(chunk_t)) {
            /* Tempting to add a goto to the block below but hopefully most compilers
             * collapse these identical code segments as one label to jump to */
            return CHUNKCOPY(out, from, len);
        }
#endif
        /* Here the memmove semantics match perfectly, as when this happens we are
         * effectively sliding down the contents of memory by dist bytes */
        memmove(out, from, len);
        return out + len;
    }

    if (dist == 1) {
        memset(out, *from, len);
        return out + len;
    } else if (dist >= sizeof(chunk_t)) {
        return CHUNKCOPY(out, from, len);
    }

    /* Only AVX2+ as there's 128 bit vectors and 256 bit. We allow for shorter vector
     * lengths because they serve to allow more cases to fall into chunkcopy, as the
     * distance of the shorter length is still deemed a safe distance. We rewrite this
     * here rather than calling the ssse3 variant directly now because doing so required
     * dispatching to another function and broke inlining for this function entirely. We
     * also can merge an assert and some remainder peeling behavior into the same code blocks,
     * making the code a little smaller.  */
#ifdef HAVE_HALF_CHUNK
    if (len <= sizeof(halfchunk_t)) {
        if (dist >= sizeof(halfchunk_t))
            return HALFCHUNKCOPY(out, from, len);

        if ((dist % 2) != 0 || dist == 6) {
            halfchunk_t halfchunk_load = GET_HALFCHUNK_MAG(from, &chunk_mod, (unsigned)dist);

            if (len == sizeof(halfchunk_t)) {
                storehalfchunk(out, &halfchunk_load);
                len -= sizeof(halfchunk_t);
                out += sizeof(halfchunk_t);
            }

            chunk_load = halfchunk2whole(&halfchunk_load);
            goto rem_bytes;
        }
    }
#endif

#ifdef HAVE_CHUNKMEMSET_2
    if (dist == 2) {
        chunkmemset_2(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_4
    if (dist == 4) {
        chunkmemset_4(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_8
    if (dist == 8) {
        chunkmemset_8(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_16
    if (dist == 16) {
        chunkmemset_16(from, &chunk_load);
    } else
#endif
    chunk_load = GET_CHUNK_MAG(from, &chunk_mod, (unsigned)dist);

    adv_amount = sizeof(chunk_t) - chunk_mod;

    while (len >= (2 * sizeof(chunk_t))) {
        storechunk(out, &chunk_load);
        storechunk(out + adv_amount, &chunk_load);
        out += 2 * adv_amount;
        len -= 2 * adv_amount;
    }

    /* If we don't have a "dist" length that divides evenly into a vector
     * register, we can write the whole vector register but we need only
     * advance by the amount of the whole string that fits in our chunk_t.
     * If we do divide evenly into the vector length, adv_amount = chunk_t size*/
    while (len >= sizeof(chunk_t)) {
        storechunk(out, &chunk_load);
        len -= adv_amount;
        out += adv_amount;
    }

#ifdef HAVE_HALF_CHUNK
rem_bytes:
#endif
    if (len) {
        memcpy(out, &chunk_load, len);
        out += len;
    }

    return out;
}